

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiobj_str.c
# Opt level: O2

size_t fiobj_str_is_eq(FIOBJ self,FIOBJ other)

{
  int iVar1;
  size_t sVar2;
  fio_str_info_s fStack_48;
  fio_str_info_s s1;
  
  if ((self & 0xfffffffffffffff8) == (other & 0xfffffffffffffff8)) {
    sVar2 = 1;
  }
  else {
    fio_str_info(&s1,(fio_str_s_conflict *)((self & 0xfffffffffffffff8) + 0x10));
    fio_str_info(&fStack_48,(fio_str_s_conflict *)((other & 0xfffffffffffffff8) + 0x10));
    if (s1.len == fStack_48.len) {
      iVar1 = bcmp(s1.data,fStack_48.data,s1.len);
      sVar2 = (size_t)(iVar1 == 0);
    }
    else {
      sVar2 = 0;
    }
  }
  return sVar2;
}

Assistant:

static size_t fiobj_str_is_eq(const FIOBJ self, const FIOBJ other) {
  return fio_str_iseq(&obj2str(self)->str, &obj2str(other)->str);
}